

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O3

bool __thiscall duckdb::FixedSizeAllocator::InitializeVacuum(FixedSizeAllocator *this)

{
  _Hash_node_base *this_00;
  BlockManager *pBVar1;
  bool bVar2;
  pointer pFVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  iterator iVar8;
  optional_idx oVar9;
  __hashtable *__h;
  iterator __begin1;
  _Hash_node_base *p_Var10;
  long lVar11;
  _Base_ptr p_Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  idx_t available_segments_in_buffer;
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  temporary_vacuum_buffers;
  optional_idx local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_68;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  if (this->total_segment_count == 0) {
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->buffers)._M_h);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&(this->buffers_with_free_space)._M_h);
    (this->buffer_with_free_space).index = 0xffffffffffffffff;
    this->total_segment_count = 0;
    return false;
  }
  RemoveEmptyBuffers(this);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar2 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var10 = (this->buffers)._M_h._M_before_begin._M_nxt;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    local_38 = &(this->buffers)._M_h;
    uVar4 = 0;
    do {
      this_00 = p_Var10 + 2;
      pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)this_00);
      pFVar3->vacuum = false;
      pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)this_00);
      bVar2 = BufferHandle::IsValid(&pFVar3->buffer_handle);
      if (bVar2) {
        iVar5 = this->available_segments_per_buffer;
        pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)this_00);
        p_Var12 = (_Base_ptr)(iVar5 - pFVar3->segment_count);
        local_70.index = (idx_t)p_Var12;
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
        ::_M_emplace_equal<unsigned_long&,unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                    *)&local_68,&local_70.index,(unsigned_long *)(p_Var10 + 1));
        uVar4 = (long)&((_Hashtable *)&p_Var12->_M_color)->_M_buckets + uVar4;
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
    if (local_68._M_impl.super__Rb_tree_header._M_node_count != 0) {
      uVar4 = uVar4 / this->available_segments_per_buffer;
      iVar5 = GetInMemorySize(this);
      pBVar1 = this->block_manager;
      iVar6 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
      iVar7 = optional_idx::GetIndex(&pBVar1->block_header_size);
      lVar11 = (iVar6 - iVar7) * uVar4;
      auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar13._0_8_ = lVar11;
      auVar13._12_4_ = 0x45300000;
      auVar14._8_4_ = (int)(iVar5 >> 0x20);
      auVar14._0_8_ = iVar5;
      auVar14._12_4_ = 0x45300000;
      if (0.1 <= ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) /
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)iVar5) - 4503599627370496.0))) {
        while (local_68._M_impl.super__Rb_tree_header._M_node_count != uVar4) {
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                              *)&local_68,
                             (iterator)local_68._M_impl.super__Rb_tree_header._M_header._M_left);
        }
        if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_68._M_impl.super__Rb_tree_header) {
          p_Var12 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_70.index = (idx_t)p_Var12[1]._M_parent;
            iVar8 = ::std::
                    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(local_38,&local_70.index);
            pFVar3 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                   *)((long)iVar8.
                                            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                            ._M_cur + 0x10));
            pFVar3->vacuum = true;
            ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(this->buffers_with_free_space)._M_h,&local_70);
            p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
          } while ((_Rb_tree_header *)p_Var12 != &local_68._M_impl.super__Rb_tree_header);
        }
        if ((this->buffers_with_free_space)._M_h._M_element_count == 0) {
          oVar9.index = 0xffffffffffffffff;
        }
        else {
          optional_idx::optional_idx
                    (&local_70,
                     (idx_t)(this->buffers_with_free_space)._M_h._M_before_begin._M_nxt[1]._M_nxt);
          oVar9.index = local_70.index;
        }
        (this->buffer_with_free_space).index = oVar9.index;
        bVar2 = true;
        if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_68._M_impl.super__Rb_tree_header) {
          p_Var12 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_70.index = (idx_t)&this->vacuum_buffers;
            ::std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&this->vacuum_buffers,&p_Var12[1]._M_parent,&local_70);
            p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
          } while ((_Rb_tree_header *)p_Var12 != &local_68._M_impl.super__Rb_tree_header);
        }
        goto LAB_00f3da3f;
      }
    }
    bVar2 = false;
  }
LAB_00f3da3f:
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&local_68);
  return bVar2;
}

Assistant:

bool FixedSizeAllocator::InitializeVacuum() {
	// NOTE: we do not vacuum buffers that are not in memory. We might consider changing this
	// in the future, although buffers on disk should almost never be eligible for a vacuum

	if (total_segment_count == 0) {
		Reset();
		return false;
	}
	RemoveEmptyBuffers();

	// determine if a vacuum is necessary
	multimap<idx_t, idx_t> temporary_vacuum_buffers;
	D_ASSERT(vacuum_buffers.empty());
	idx_t available_segments_in_memory = 0;

	for (auto &buffer : buffers) {
		buffer.second->vacuum = false;
		if (buffer.second->InMemory()) {
			auto available_segments_in_buffer = available_segments_per_buffer - buffer.second->segment_count;
			available_segments_in_memory += available_segments_in_buffer;
			temporary_vacuum_buffers.emplace(available_segments_in_buffer, buffer.first);
		}
	}

	// no buffers in memory
	if (temporary_vacuum_buffers.empty()) {
		return false;
	}

	auto excess_buffer_count = available_segments_in_memory / available_segments_per_buffer;

	// calculate the vacuum threshold adaptively
	D_ASSERT(excess_buffer_count < temporary_vacuum_buffers.size());
	idx_t memory_usage = GetInMemorySize();
	idx_t excess_memory_usage = excess_buffer_count * block_manager.GetBlockSize();
	auto excess_percentage = double(excess_memory_usage) / double(memory_usage);
	auto threshold = double(VACUUM_THRESHOLD) / 100.0;
	if (excess_percentage < threshold) {
		return false;
	}

	D_ASSERT(excess_buffer_count <= temporary_vacuum_buffers.size());
	D_ASSERT(temporary_vacuum_buffers.size() <= buffers.size());

	// erasing from a multimap, we vacuum the buffers with the most free spaces (least full)
	while (temporary_vacuum_buffers.size() != excess_buffer_count) {
		temporary_vacuum_buffers.erase(temporary_vacuum_buffers.begin());
	}

	// adjust the buffers, and erase all to-be-vacuumed buffers from the available buffer list
	for (auto &vacuum_buffer : temporary_vacuum_buffers) {
		auto buffer_id = vacuum_buffer.second;
		D_ASSERT(buffers.find(buffer_id) != buffers.end());
		buffers.find(buffer_id)->second->vacuum = true;
		buffers_with_free_space.erase(buffer_id);
	}
	D_ASSERT(!buffers_with_free_space.empty());
	NextBufferWithFreeSpace();

	for (auto &vacuum_buffer : temporary_vacuum_buffers) {
		vacuum_buffers.insert(vacuum_buffer.second);
	}
	return true;
}